

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_mrihtol.c
# Opt level: O0

int SUNAdaptController_EstimateStepTol_MRIHTol
              (SUNAdaptController C,sunrealtype H,sunrealtype tolfac,int P,sunrealtype DSM,
              sunrealtype dsm,sunrealtype *Hnew,sunrealtype *tolfacnew)

{
  double *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  sunrealtype tolfacest;
  SUNContext_conflict sunctx_local_scope_;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  long local_48;
  double *local_40;
  undefined8 local_30;
  double local_18;
  long *local_8;
  
  local_48 = in_RDI[2];
  local_40 = in_RCX;
  local_30 = in_XMM3_Qa;
  local_18 = in_XMM1_Qa;
  local_8 = in_RDI;
  SUNAdaptController_EstimateStep(in_XMM0_Qa,in_XMM2_Qa,*(undefined8 *)*in_RDI,in_ESI,in_RDX);
  SUNAdaptController_EstimateStep(local_18,local_30,*(undefined8 *)(*local_8 + 8),0,&local_50);
  if (local_50 <= local_18 / *(double *)(*local_8 + 0x10)) {
    local_58 = local_18 / *(double *)(*local_8 + 0x10);
  }
  else {
    local_58 = local_50;
  }
  if (local_18 * *(double *)(*local_8 + 0x10) <= local_58) {
    local_60 = local_18 * *(double *)(*local_8 + 0x10);
  }
  else {
    local_60 = local_58;
  }
  if (local_60 < *(double *)(*local_8 + 0x18) || local_60 == *(double *)(*local_8 + 0x18)) {
    local_68 = *(double *)(*local_8 + 0x18);
  }
  else {
    local_68 = local_60;
  }
  if (*(double *)(*local_8 + 0x20) <= local_68) {
    local_70 = *(double *)(*local_8 + 0x20);
  }
  else {
    local_70 = local_68;
  }
  *local_40 = local_70;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStepTol_MRIHTol(
  SUNAdaptController C, sunrealtype H, sunrealtype tolfac, int P,
  sunrealtype DSM, sunrealtype dsm, sunrealtype* Hnew, sunrealtype* tolfacnew)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(Hnew, SUN_ERR_ARG_CORRUPT);
  SUNAssert(tolfacnew, SUN_ERR_ARG_CORRUPT);
  sunrealtype tolfacest;

  /* Call slow time scale sub-controller to fill Hnew -- note that all heuristics
     bounds on Hnew will be enforced by the time integrator itself */
  SUNCheckCall(SUNAdaptController_EstimateStep(MRIHTOL_CSLOW(C), H, P, DSM, Hnew));

  /* Call fast time scale sub-controller with order=1: no matter the integrator
     order, we expect its error to be proportional to the tolerance factor */
  SUNCheckCall(SUNAdaptController_EstimateStep(MRIHTOL_CFAST(C), tolfac, 0, dsm,
                                               &tolfacest));

  /* Enforce bounds on estimated tolerance factor */
  /*     keep relative change within bounds */
  tolfacest = SUNMAX(tolfacest, tolfac / MRIHTOL_INNER_MAX_RELCH(C));
  tolfacest = SUNMIN(tolfacest, tolfac * MRIHTOL_INNER_MAX_RELCH(C));
  /*     enforce absolute min/max bounds */
  tolfacest = SUNMAX(tolfacest, MRIHTOL_INNER_MIN_TOLFAC(C));
  tolfacest = SUNMIN(tolfacest, MRIHTOL_INNER_MAX_TOLFAC(C));

  /* Set result and return */
  *tolfacnew = tolfacest;
  return SUN_SUCCESS;
}